

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::rotL(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  BasicType BVar1;
  uint init;
  unsigned_long init_00;
  Literal *other_local;
  Literal *this_local;
  
  BVar1 = wasm::Type::getBasic(&this->type);
  if (BVar1 == i32) {
    init = Bits::rotateLeft<unsigned_int,unsigned_int>((this->field_0).i32,(other->field_0).i32);
    Literal(__return_storage_ptr__,init);
  }
  else {
    if (BVar1 != i64) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x592);
    }
    init_00 = Bits::rotateLeft<unsigned_long,unsigned_long>
                        ((this->field_0).func.super_IString.str._M_len,
                         (other->field_0).func.super_IString.str._M_len);
    Literal(__return_storage_ptr__,init_00);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::rotL(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(Bits::rotateLeft(uint32_t(i32), uint32_t(other.i32)));
    case Type::i64:
      return Literal(Bits::rotateLeft(uint64_t(i64), uint64_t(other.i64)));
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}